

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  ArgBinder *pAVar1;
  CommandLine<Catch::ConfigData> *in_RDI;
  allocator local_1061;
  string local_1060 [39];
  allocator local_1039;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [39];
  allocator local_fe9;
  string local_fe8 [32];
  ArgBinder local_fc8;
  allocator local_f31;
  string local_f30 [39];
  allocator local_f09;
  string local_f08 [32];
  ArgBinder local_ee8;
  allocator local_e51;
  string local_e50 [39];
  allocator local_e29;
  string local_e28 [39];
  allocator local_e01;
  string local_e00 [39];
  allocator local_dd9;
  string local_dd8 [32];
  ArgBinder local_db8;
  allocator local_d21;
  string local_d20 [39];
  allocator local_cf9;
  string local_cf8 [39];
  allocator local_cd1;
  string local_cd0 [39];
  allocator local_ca9;
  string local_ca8 [32];
  ArgBinder local_c88;
  allocator local_bf1;
  string local_bf0 [39];
  allocator local_bc9;
  string local_bc8 [39];
  allocator local_ba1;
  string local_ba0 [32];
  ArgBinder local_b80;
  allocator local_ae9;
  string local_ae8 [39];
  allocator local_ac1;
  string local_ac0 [39];
  allocator local_a99;
  string local_a98 [39];
  allocator local_a71;
  string local_a70 [32];
  ArgBinder local_a50;
  allocator local_9b9;
  string local_9b8 [39];
  allocator local_991;
  string local_990 [39];
  allocator local_969;
  string local_968 [39];
  allocator local_941;
  string local_940 [32];
  ArgBinder local_920;
  allocator local_889;
  string local_888 [39];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [39];
  allocator local_811;
  string local_810 [32];
  ArgBinder local_7f0;
  allocator local_759;
  string local_758 [39];
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [32];
  ArgBinder local_6e8;
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [39];
  allocator local_601;
  string local_600 [32];
  ArgBinder local_5e0;
  allocator local_549;
  string local_548 [39];
  allocator local_521;
  string local_520 [39];
  allocator local_4f9;
  string local_4f8 [32];
  ArgBinder local_4d8;
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  ArgBinder local_3f8;
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [32];
  ArgBinder local_2f0;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  ArgBinder local_1e8;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  ArgBinder local_b8;
  undefined1 local_11;
  CommandLine<Catch::ConfigData> *cli;
  
  local_11 = 0;
  Clara::CommandLine<Catch::ConfigData>::CommandLine(in_RDI);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
            (in_RDI,0x78);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_b8,in_RDI,6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"display usage information",&local_d9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe(&local_b8,(string *)local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"?",&local_101);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_100);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"h",&local_129);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"help",&local_151);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_b8);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_1e8,in_RDI,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"list all (or matching) test cases",&local_209);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_1e8,(string *)local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"l",&local_231);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_230);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"list-tests",&local_259);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_1e8);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_2f0,in_RDI,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"list all (or matching) tags",&local_311);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_2f0,(string *)local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"t",&local_339);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"list-tags",&local_361);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_360);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_2f0);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_3f8,in_RDI,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"list all reporters",&local_419);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_3f8,(string *)local_418);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"list-reporters",&local_441);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_440);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_3f8);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_4d8,in_RDI,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"include successful tests in output",&local_4f9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_4d8,(string *)local_4f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_520,"s",&local_521);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"success",&local_549);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_548);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_4d8);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_5e0,in_RDI,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_600,"break into debugger on failure",&local_601);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_5e0,(string *)local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"b",&local_629);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_650,"break",&local_651);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_650);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::__cxx11::string::~string(local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_5e0);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>(&local_6e8,in_RDI,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"skip exception tests",&local_709);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_6e8,(string *)local_708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"e",&local_731);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_758,"nothrow",&local_759);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_758);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_6e8);
  Clara::CommandLine<Catch::ConfigData>::bind<std::__cxx11::string_Catch::ConfigData::*>
            (&local_7f0,in_RDI,0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"output filename",&local_811);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_7f0,(string *)local_810);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"o",&local_839);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_838);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"out",&local_861);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_860);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_888,"filename",&local_889);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_888);
  std::__cxx11::string::~string(local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_7f0);
  Clara::CommandLine<Catch::ConfigData>::bind<std::__cxx11::string_Catch::ConfigData::*>
            (&local_920,in_RDI,0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_940,"reporter to use - defaults to console",&local_941);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_920,(string *)local_940);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_968,"r",&local_969);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_968);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_990,"reporter",&local_991);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_990);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b8,"name",&local_9b9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_9b8);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
  std::__cxx11::string::~string(local_990);
  std::allocator<char>::~allocator((allocator<char> *)&local_991);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator((allocator<char> *)&local_941);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_920);
  Clara::CommandLine<Catch::ConfigData>::bind<std::__cxx11::string_Catch::ConfigData::*>
            (&local_a50,in_RDI,0x58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a70,"suite name",&local_a71);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_a50,(string *)local_a70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"n",&local_a99);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_a98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ac0,"name",&local_ac1);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_ac0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae8,"name",&local_ae9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_ae8);
  std::__cxx11::string::~string(local_ae8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae9);
  std::__cxx11::string::~string(local_ac0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ac1);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator((allocator<char> *)&local_a71);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_a50);
  Clara::CommandLine<Catch::ConfigData>::bind<void(*)(Catch::ConfigData&)>
            (&local_b80,in_RDI,abortAfterFirst);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ba0,"abort at first failure",&local_ba1);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_b80,(string *)local_ba0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc8,"a",&local_bc9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_bc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bf0,"abort",&local_bf1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_bf0);
  std::__cxx11::string::~string(local_bf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf1);
  std::__cxx11::string::~string(local_bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc9);
  std::__cxx11::string::~string(local_ba0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_b80);
  Clara::CommandLine<Catch::ConfigData>::bind<void(*)(Catch::ConfigData&,int)>
            (&local_c88,in_RDI,abortAfterX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca8,"abort after x failures",&local_ca9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_c88,(string *)local_ca8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd0,"x",&local_cd1);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_cd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf8,"abortx",&local_cf9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_cf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d20,"number of failures",&local_d21);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_d20);
  std::__cxx11::string::~string(local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  std::__cxx11::string::~string(local_cf8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf9);
  std::__cxx11::string::~string(local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  std::__cxx11::string::~string(local_ca8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_c88);
  Clara::CommandLine<Catch::ConfigData>::
  bind<void(*)(Catch::ConfigData&,std::__cxx11::string_const&)>(&local_db8,in_RDI,addWarning);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd8,"enable warnings",&local_dd9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_db8,(string *)local_dd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e00,"w",&local_e01);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_e00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e28,"warn",&local_e29);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_e28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e50,"warning name",&local_e51);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_e50);
  std::__cxx11::string::~string(local_e50);
  std::allocator<char>::~allocator((allocator<char> *)&local_e51);
  std::__cxx11::string::~string(local_e28);
  std::allocator<char>::~allocator((allocator<char> *)&local_e29);
  std::__cxx11::string::~string(local_e00);
  std::allocator<char>::~allocator((allocator<char> *)&local_e01);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_db8);
  Clara::CommandLine<Catch::ConfigData>::
  bind<void(*)(Catch::ConfigData&,std::__cxx11::string_const&)>(&local_ee8,in_RDI,addTestOrTags);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"which test or tests to use",&local_f09);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_ee8,(string *)local_f08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f30,"test name, pattern or tags",&local_f31);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_f30);
  std::__cxx11::string::~string(local_f30);
  std::allocator<char>::~allocator((allocator<char> *)&local_f31);
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_ee8);
  Clara::CommandLine<Catch::ConfigData>::bind<void(*)(Catch::ConfigData&,bool)>
            (&local_fc8,in_RDI,setShowDurations);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fe8,"show test durations",&local_fe9);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
                     (&local_fc8,(string *)local_fe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1010,"d",&local_1011);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt(pAVar1,(string *)local_1010);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,"durations",&local_1039);
  pAVar1 = Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt(pAVar1,(string *)local_1038);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1060,"yes/no",&local_1061);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::hint(pAVar1,(string *)local_1060);
  std::__cxx11::string::~string(local_1060);
  std::allocator<char>::~allocator((allocator<char> *)&local_1061);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)&local_1011);
  std::__cxx11::string::~string(local_fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(&local_fc8);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        Clara::CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli.bind( &ConfigData::showHelp )
            .describe( "display usage information" )
            .shortOpt( "?")
            .shortOpt( "h")
            .longOpt( "help" );

        cli.bind( &ConfigData::listTests )
            .describe( "list all (or matching) test cases" )
            .shortOpt( "l")
            .longOpt( "list-tests" );

        cli.bind( &ConfigData::listTags )
            .describe( "list all (or matching) tags" )
            .shortOpt( "t")
            .longOpt( "list-tags" );

        cli.bind( &ConfigData::listReporters )
            .describe( "list all reporters" )
            .longOpt( "list-reporters" );

        cli.bind( &ConfigData::showSuccessfulTests )
            .describe( "include successful tests in output" )
            .shortOpt( "s")
            .longOpt( "success" );

        cli.bind( &ConfigData::shouldDebugBreak )
            .describe( "break into debugger on failure" )
            .shortOpt( "b")
            .longOpt( "break" );

        cli.bind( &ConfigData::noThrow )
            .describe( "skip exception tests" )
            .shortOpt( "e")
            .longOpt( "nothrow" );

        cli.bind( &ConfigData::outputFilename )
            .describe( "output filename" )
            .shortOpt( "o")
            .longOpt( "out" )
            .hint( "filename" );

        cli.bind( &ConfigData::reporterName )
            .describe( "reporter to use - defaults to console" )
            .shortOpt( "r")
            .longOpt( "reporter" )
//            .hint( "name[:filename]" );
            .hint( "name" );

        cli.bind( &ConfigData::name )
            .describe( "suite name" )
            .shortOpt( "n")
            .longOpt( "name" )
            .hint( "name" );

        cli.bind( &abortAfterFirst )
            .describe( "abort at first failure" )
            .shortOpt( "a")
            .longOpt( "abort" );

        cli.bind( &abortAfterX )
            .describe( "abort after x failures" )
            .shortOpt( "x")
            .longOpt( "abortx" )
            .hint( "number of failures" );

        cli.bind( &addWarning )
            .describe( "enable warnings" )
            .shortOpt( "w")
            .longOpt( "warn" )
            .hint( "warning name" );

//        cli.bind( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .hint( "level" );

        cli.bind( &addTestOrTags )
            .describe( "which test or tests to use" )
            .hint( "test name, pattern or tags" );

        cli.bind( &setShowDurations )
            .describe( "show test durations" )
            .shortOpt( "d")
            .longOpt( "durations" )
            .hint( "yes/no" );

        return cli;
    }